

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SpectrumImageTexture::Evaluate
          (SpectrumImageTexture *this,TextureEvalContext ctx,SampledWavelengths lambda)

{
  RGBColorSpace *cs;
  float fVar1;
  anon_class_24_3_48d30edf func;
  undefined8 uVar6;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar8 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar9 [16];
  RGB RVar10;
  undefined1 local_c0 [16];
  Tuple2<pbrt::Vector2,_float> **local_b0;
  RGB local_a8;
  RGBIlluminantSpectrum local_98;
  Tuple3<pbrt::Vector3,_float> aTStack_80 [3];
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  Tuple2<pbrt::Vector2,_float> local_40;
  Tuple2<pbrt::Vector2,_float> local_38;
  Tuple2<pbrt::Vector2,_float> *local_30;
  SampledSpectrum local_28;
  ulong uVar7;
  undefined1 extraout_var [56];
  
  local_c0._0_8_ = &local_98;
  local_a8._0_8_ = &local_38;
  local_30 = &local_40;
  local_c0._8_8_ = &local_a8;
  local_b0 = &local_30;
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_98.scale = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_98.rsp.c0 = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_98.rsp.c1 = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_98.rsp.c2 = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_98.illuminant = (DenselySampledSpectrum *)ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_;
  aTStack_80[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_80[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_80[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_80[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_80[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_80[1].z = ctx.dudx;
  aTStack_80[2].x = ctx.dudy;
  aTStack_80[2].y = ctx.dvdx;
  aTStack_80[2].z = ctx.dvdy;
  iStack_5c = ctx.faceIndex;
  func.dstdx = (Vector2f **)local_c0._8_8_;
  func.ctx = (TextureEvalContext *)local_c0._0_8_;
  func.dstdy = (Vector2f **)local_b0;
  auVar3._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                 ::
                 Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                             *)this,func);
  auVar3._8_56_ = extraout_var;
  auVar2 = vmovshdup_avx(auVar3._0_16_);
  local_58 = (this->super_ImageTextureBase).scale;
  auVar2 = vinsertps_avx(auVar3._0_16_,ZEXT416((uint)(1.0 - auVar2._0_4_)),0x10);
  uVar6 = auVar2._8_8_;
  fStack_54 = local_58;
  fStack_50 = local_58;
  fStack_4c = local_58;
  RVar10 = MIPMap::Filter<pbrt::RGB>
                     ((this->super_ImageTextureBase).mipmap,(Point2f)auVar2._0_8_,(Vector2f)local_38
                      ,(Vector2f)local_40);
  auVar2._0_4_ = local_58 * RVar10.r;
  auVar2._4_4_ = fStack_54 * RVar10.g;
  auVar2._8_4_ = fStack_50 * (float)uVar6;
  auVar2._12_4_ = fStack_4c * (float)((ulong)uVar6 >> 0x20);
  uVar7 = auVar2._8_8_;
  fVar1 = local_58 * RVar10.b;
  local_c0._0_8_ = vmovlps_avx(auVar2);
  local_98._0_8_ = local_c0._0_8_;
  local_98.rsp.c1 = fVar1;
  if ((this->super_ImageTextureBase).invert == true) {
    auVar9._8_4_ = 0x3f800000;
    auVar9._0_8_ = 0x3f8000003f800000;
    auVar9._12_4_ = 0x3f800000;
    auVar2 = vsubps_avx(auVar9,auVar2);
    uVar7 = auVar2._8_8_;
    local_98._0_8_ = vmovlps_avx(auVar2);
    local_98.rsp.c1 = 1.0 - fVar1;
  }
  auVar8 = ZEXT856(uVar7);
  local_c0._8_4_ = fVar1;
  RVar10 = ClampZero((RGB *)&local_98);
  auVar4._0_8_ = RVar10._0_8_;
  auVar4._8_56_ = auVar8;
  local_c0._0_8_ = vmovlps_avx(auVar4._0_16_);
  local_c0._8_4_ = RVar10.b;
  cs = ((this->super_ImageTextureBase).mipmap)->colorSpace;
  if (cs == (RGBColorSpace *)0x0) {
    SampledSpectrum::SampledSpectrum(&local_28,RVar10.r);
  }
  else if (this->spectrumType == Albedo) {
    RVar10 = Clamp<int,int>((RGB *)local_c0,0,1);
    local_a8.b = RVar10.b;
    auVar5._0_8_ = RVar10._0_8_;
    auVar5._8_56_ = auVar8;
    local_a8._0_8_ = vmovlps_avx(auVar5._0_16_);
    RGBAlbedoSpectrum::RGBAlbedoSpectrum((RGBAlbedoSpectrum *)&local_98,cs,&local_a8);
    local_28 = RGBAlbedoSpectrum::Sample((RGBAlbedoSpectrum *)&local_98,&lambda);
  }
  else if (this->spectrumType == Unbounded) {
    RGBUnboundedSpectrum::RGBUnboundedSpectrum((RGBUnboundedSpectrum *)&local_98,cs,(RGB *)local_c0)
    ;
    local_28 = RGBUnboundedSpectrum::Sample((RGBUnboundedSpectrum *)&local_98,&lambda);
  }
  else {
    RGBIlluminantSpectrum::RGBIlluminantSpectrum(&local_98,cs,(RGB *)local_c0);
    local_28 = RGBIlluminantSpectrum::Sample(&local_98,&lambda);
  }
  return (array<float,_4>)(array<float,_4>)local_28;
}

Assistant:

SampledSpectrum SpectrumImageTexture::Evaluate(TextureEvalContext ctx,
                                               SampledWavelengths lambda) const {
#ifdef PBRT_IS_GPU_CODE
    assert(!"Should not be called in GPU code");
    return SampledSpectrum(0);
#else
    // Apply texture mapping and flip $t$ coordinate for image texture lookup
    Vector2f dstdx, dstdy;
    Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
    st[1] = 1 - st[1];

    // Lookup filtered RGB value in _MIPMap_
    RGB rgb = scale * mipmap->Filter<RGB>(st, dstdx, dstdy);
    rgb = ClampZero(invert ? (RGB(1, 1, 1) - rgb) : rgb);

    // Return _SampledSpectrum_ for RGB image texture value
    if (const RGBColorSpace *cs = mipmap->GetRGBColorSpace(); cs != nullptr) {
        if (spectrumType == SpectrumType::Unbounded)
            return RGBUnboundedSpectrum(*cs, rgb).Sample(lambda);
        else if (spectrumType == SpectrumType::Albedo)
            return RGBAlbedoSpectrum(*cs, Clamp(rgb, 0, 1)).Sample(lambda);
        else
            return RGBIlluminantSpectrum(*cs, rgb).Sample(lambda);
    }
    // otherwise it better be a one-channel texture
    DCHECK(rgb[0] == rgb[1] && rgb[1] == rgb[2]);
    return SampledSpectrum(rgb[0]);

#endif
}